

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsview.cpp
# Opt level: O0

QPolygonF * __thiscall QGraphicsView::mapToScene(QGraphicsView *this,QPolygon *polygon)

{
  bool bVar1;
  const_iterator o;
  QGraphicsView *in_RDX;
  QList<QPointF> *in_RSI;
  rvalue_ref in_RDI;
  long in_FS_OFFSET;
  QPoint *point;
  QPolygon *__range1;
  QPolygonF *poly;
  const_iterator __end1;
  const_iterator __begin1;
  undefined7 in_stack_ffffffffffffffb0;
  undefined1 uVar2;
  const_iterator local_10;
  qsizetype asize;
  
  asize = *(qsizetype *)(in_FS_OFFSET + 0x28);
  uVar2 = 0;
  (((QList<QPointF> *)&in_RDI->xp)->d).d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  in_RDI->yp = (qreal)&DAT_aaaaaaaaaaaaaaaa;
  in_RDI[1].xp = (qreal)&DAT_aaaaaaaaaaaaaaaa;
  QPolygonF::QPolygonF((QPolygonF *)0xa3ad75);
  QList<QPoint>::size((QList<QPoint> *)in_RDX);
  QList<QPointF>::reserve((QList<QPointF> *)in_RDX,asize);
  local_10.i = (QPoint *)&DAT_aaaaaaaaaaaaaaaa;
  local_10 = QList<QPoint>::begin((QList<QPoint> *)in_RSI);
  o = QList<QPoint>::end((QList<QPoint> *)in_RSI);
  while (bVar1 = QList<QPoint>::const_iterator::operator!=(&local_10,o), bVar1) {
    QList<QPoint>::const_iterator::operator*(&local_10);
    mapToScene(in_RDX,(QPoint *)CONCAT17(uVar2,in_stack_ffffffffffffffb0));
    QList<QPointF>::operator<<(in_RSI,in_RDI);
    QList<QPoint>::const_iterator::operator++(&local_10);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != asize) {
    __stack_chk_fail();
  }
  return (QPolygonF *)in_RDI;
}

Assistant:

QPolygonF QGraphicsView::mapToScene(const QPolygon &polygon) const
{
    QPolygonF poly;
    poly.reserve(polygon.size());
    for (const QPoint &point : polygon)
        poly << mapToScene(point);
    return poly;
}